

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread_test.c
# Opt level: O3

void * mutex_performance_test_loop_1(void *arg)

{
  int iVar1;
  
  iVar1 = 10000;
  do {
    pthread_mutex_lock((pthread_mutex_t *)&mutex_1);
    if (flag_1 != 0) {
      pthread_cond_wait((pthread_cond_t *)&cond_1,(pthread_mutex_t *)&mutex_1);
    }
    pthread_mutex_lock((pthread_mutex_t *)&mutex_0);
    flag_0 = 0;
    pthread_cond_signal((pthread_cond_t *)&cond_0);
    pthread_mutex_unlock((pthread_mutex_t *)&mutex_0);
    flag_1 = 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex_1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return (void *)0x0;
}

Assistant:

void *mutex_performance_test_loop_1(void *arg)
{
    RK_S32 i = 0;

    for (i = 0; i < MAX_LOCK_LOOP; i++) {
        thread_dbg("1 %5d lock\n", i);
        pthread_mutex_lock(&mutex_1);

        thread_dbg("1 %5d wait flag %d\n", i, flag_1);
        if (flag_1) {
            pthread_cond_wait(&cond_1, &mutex_1);
        }

        thread_dbg("1 %5d signal\n", i);
        pthread_mutex_lock(&mutex_0);
        flag_0 = 0;
        pthread_cond_signal(&cond_0);
        pthread_mutex_unlock(&mutex_0);

        thread_dbg("1 %5d unlock\n", i);
        flag_1 = 1;
        pthread_mutex_unlock(&mutex_1);
    }
    (void)arg;
    return NULL;
}